

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_segmentation_dequant(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  _Bool _Var1;
  int16_t iVar2;
  int iVar3;
  CommonQuantParams *quant_params_00;
  qm_val_t *pqVar4;
  macroblockd *in_RSI;
  long in_RDI;
  int j_2;
  int qmlevel_v;
  int j_1;
  int qmlevel_u;
  int j;
  int qmlevel_y;
  int use_qmatrix;
  int qindex;
  int i;
  CommonQuantParams *quant_params;
  int max_segments;
  int bit_depth;
  aom_bit_depth_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int qmlevel;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_24;
  
  iVar3 = 1;
  if (*(char *)(in_RDI + 19000) != '\0') {
    iVar3 = 8;
  }
  quant_params_00 = (CommonQuantParams *)(in_RDI + 0x268);
  for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
    iVar2 = av1_dc_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8);
    *(int16_t *)(in_RDI + 0x284 + (long)local_24 * 4) = iVar2;
    iVar2 = av1_ac_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8);
    *(int16_t *)(in_RDI + 0x286 + (long)local_24 * 4) = iVar2;
    iVar2 = av1_dc_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8);
    *(int16_t *)(in_RDI + 0x2a4 + (long)local_24 * 4) = iVar2;
    iVar2 = av1_ac_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8);
    *(int16_t *)(in_RDI + 0x2a6 + (long)local_24 * 4) = iVar2;
    iVar2 = av1_dc_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8);
    *(int16_t *)(in_RDI + 0x2c4 + (long)local_24 * 4) = iVar2;
    iVar2 = av1_ac_quant_QTX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8);
    *(int16_t *)(in_RDI + 0x2c6 + (long)local_24 * 4) = iVar2;
    _Var1 = av1_use_qmatrix(quant_params_00,in_RSI,local_24);
    if (_Var1) {
      local_48 = *(int *)(in_RDI + 0x4a2c);
    }
    else {
      local_48 = 0xf;
    }
    for (local_34 = 0; local_34 < 0x13; local_34 = local_34 + 1) {
      pqVar4 = get_iqmatrix(quant_params_00,local_48,0,(TX_SIZE)local_34);
      *(qm_val_t **)(in_RDI + 0x3be8 + (long)local_24 * 0x98 + (long)local_34 * 8) = pqVar4;
    }
    if (_Var1) {
      local_4c = *(int *)(in_RDI + 0x4a30);
    }
    else {
      local_4c = 0xf;
    }
    for (local_3c = 0; local_3c < 0x13; local_3c = local_3c + 1) {
      pqVar4 = get_iqmatrix(quant_params_00,local_4c,1,(TX_SIZE)local_3c);
      *(qm_val_t **)(in_RDI + 0x40a8 + (long)local_24 * 0x98 + (long)local_3c * 8) = pqVar4;
    }
    if (_Var1) {
      qmlevel = *(int *)(in_RDI + 0x4a34);
    }
    else {
      qmlevel = 0xf;
    }
    in_stack_ffffffffffffffb0 = qmlevel;
    for (local_44 = 0; local_44 < 0x13; local_44 = local_44 + 1) {
      pqVar4 = get_iqmatrix(quant_params_00,qmlevel,2,(TX_SIZE)local_44);
      *(qm_val_t **)(in_RDI + 0x4568 + (long)local_24 * 0x98 + (long)local_44 * 8) = pqVar4;
    }
  }
  return;
}

Assistant:

static inline void setup_segmentation_dequant(AV1_COMMON *const cm,
                                              MACROBLOCKD *const xd) {
  const int bit_depth = cm->seq_params->bit_depth;
  // When segmentation is disabled, only the first value is used.  The
  // remaining are don't cares.
  const int max_segments = cm->seg.enabled ? MAX_SEGMENTS : 1;
  CommonQuantParams *const quant_params = &cm->quant_params;
  for (int i = 0; i < max_segments; ++i) {
    const int qindex = xd->qindex[i];
    quant_params->y_dequant_QTX[i][0] =
        av1_dc_quant_QTX(qindex, quant_params->y_dc_delta_q, bit_depth);
    quant_params->y_dequant_QTX[i][1] = av1_ac_quant_QTX(qindex, 0, bit_depth);
    quant_params->u_dequant_QTX[i][0] =
        av1_dc_quant_QTX(qindex, quant_params->u_dc_delta_q, bit_depth);
    quant_params->u_dequant_QTX[i][1] =
        av1_ac_quant_QTX(qindex, quant_params->u_ac_delta_q, bit_depth);
    quant_params->v_dequant_QTX[i][0] =
        av1_dc_quant_QTX(qindex, quant_params->v_dc_delta_q, bit_depth);
    quant_params->v_dequant_QTX[i][1] =
        av1_ac_quant_QTX(qindex, quant_params->v_ac_delta_q, bit_depth);
    const int use_qmatrix = av1_use_qmatrix(quant_params, xd, i);
    // NB: depends on base index so there is only 1 set per frame
    // No quant weighting when lossless or signalled not using QM
    const int qmlevel_y =
        use_qmatrix ? quant_params->qmatrix_level_y : NUM_QM_LEVELS - 1;
    for (int j = 0; j < TX_SIZES_ALL; ++j) {
      quant_params->y_iqmatrix[i][j] =
          get_iqmatrix(quant_params, qmlevel_y, AOM_PLANE_Y, j);
    }
    const int qmlevel_u =
        use_qmatrix ? quant_params->qmatrix_level_u : NUM_QM_LEVELS - 1;
    for (int j = 0; j < TX_SIZES_ALL; ++j) {
      quant_params->u_iqmatrix[i][j] =
          get_iqmatrix(quant_params, qmlevel_u, AOM_PLANE_U, j);
    }
    const int qmlevel_v =
        use_qmatrix ? quant_params->qmatrix_level_v : NUM_QM_LEVELS - 1;
    for (int j = 0; j < TX_SIZES_ALL; ++j) {
      quant_params->v_iqmatrix[i][j] =
          get_iqmatrix(quant_params, qmlevel_v, AOM_PLANE_V, j);
    }
  }
}